

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register.cpp
# Opt level: O0

optional<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
* __thiscall
bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetByEdition
          (optional<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
           *__return_storage_ptr__,SubjectSetRegister *this,uint32_t edition)

{
  bool bVar1;
  pointer ppVar2;
  element_type *this_00;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  *__t;
  _Self local_58;
  key_type local_4c;
  _Self local_48;
  iterator edition_data;
  undefined1 local_30 [8];
  unique_lock<std::mutex> lck;
  uint32_t edition_local;
  SubjectSetRegister *this_local;
  
  lck._12_4_ = edition;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_30,&this->mutex_);
  RemoveEditionsOlderThan(this,lck._12_4_);
  local_4c = lck._12_4_;
  local_48._M_node =
       (_Base_ptr)
       std::
       map<int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>_>
       ::find(&this->subject_set_cache_,&local_4c);
  local_58._M_node =
       (_Base_ptr)
       std::
       map<int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>_>
       ::end(&this->subject_set_cache_);
  bVar1 = std::operator==(&local_48,&local_58);
  if (bVar1) {
    std::
    optional<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
    ::optional(__return_storage_ptr__);
  }
  else {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>
             ::operator->(&local_48);
    this_00 = std::
              __shared_ptr_access<bidfx_public_api::price::pixie::EditionData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<bidfx_public_api::price::pixie::EditionData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&ppVar2->second);
    __t = EditionData::GetSubjects(this_00);
    std::
    optional<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
    ::
    optional<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_&,_true>
              (__return_storage_ptr__,__t);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::vector<Subject>> SubjectSetRegister::SubjectSetByEdition(uint32_t edition)
{
    std::unique_lock<std::mutex> lck(mutex_);

    RemoveEditionsOlderThan(edition);

    auto edition_data = subject_set_cache_.find(edition);
    if (edition_data == subject_set_cache_.end())
    {
        return {};
    }

    return edition_data->second->GetSubjects();
}